

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
::rebalance_left_to_right
          (btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
           *this,int to_move,
          btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
          *right,allocator_type *alloc)

{
  int32 iVar1;
  int32 iVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  field_type fVar6;
  int iVar7;
  slot_type *dest;
  btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
  *pbVar8;
  btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
  *pbVar9;
  slot_type *psVar10;
  slot_type *psVar11;
  template_ElementType<2L> *ptVar12;
  template_ElementType<1L> *ptVar13;
  slot_type *src;
  uint i;
  int iVar14;
  slot_type *src_1;
  ulong local_48;
  slot_type *local_38;
  
  pbVar8 = parent(this);
  pbVar9 = parent(right);
  if (pbVar8 != pbVar9) {
    __assert_fail("parent() == right->parent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x627,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>]"
                 );
  }
  bVar3 = position(this);
  bVar4 = position(right);
  if (bVar3 + 1 != (uint)bVar4) {
    __assert_fail("position() + 1 == right->position()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x628,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>]"
                 );
  }
  bVar3 = count(this);
  bVar4 = count(right);
  if (bVar3 < bVar4) {
    __assert_fail("count() >= right->count()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x629,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>]"
                 );
  }
  if (0 < to_move) {
    bVar3 = count(this);
    if ((uint)to_move <= (uint)bVar3) {
      bVar3 = count(right);
      if ((uint)bVar3 < (uint)to_move) {
        bVar3 = count(right);
        uninitialized_move_n(right,(ulong)bVar3,0,(ulong)(uint)to_move,right,alloc);
        pbVar8 = parent(this);
        bVar3 = position(this);
        local_38 = slot(pbVar8,(uint)bVar3);
        btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>
        ::
        value_init<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>::slot_type*>
                  ((btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>
                    *)right,(ulong)(to_move - 1U),alloc,&local_38);
        bVar3 = count(right);
        iVar7 = ~(uint)bVar3 + to_move;
        bVar3 = count(this);
        bVar4 = count(right);
        uninitialized_move_n(this,(long)iVar7,(ulong)bVar3 - (long)iVar7,(ulong)bVar4,right,alloc);
        bVar3 = count(this);
        psVar10 = slot(this,(uint)bVar3 - (to_move - 1U));
        bVar3 = count(this);
        psVar11 = slot(this,(uint)bVar3 - iVar7);
        ptVar12 = btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>
                  ::GetField<2l>((btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>
                                  *)right);
        for (; psVar10 != psVar11; psVar10 = psVar10 + 1) {
          iVar1 = (psVar10->value).shape_id_;
          iVar2 = (psVar10->value).edge_id_;
          (ptVar12->value).distance_.super_S1ChordAngle.length2_ =
               (psVar10->value).distance_.super_S1ChordAngle.length2_;
          (ptVar12->value).shape_id_ = iVar1;
          (ptVar12->value).edge_id_ = iVar2;
          ptVar12 = ptVar12 + 1;
        }
      }
      else {
        bVar3 = count(right);
        bVar4 = count(right);
        uninitialized_move_n
                  (right,(ulong)(uint)to_move,(long)(int)((uint)bVar3 - to_move),(ulong)bVar4,right,
                   alloc);
        bVar3 = count(right);
        psVar10 = slot(right,~to_move + (uint)bVar3);
        bVar3 = count(right);
        psVar11 = slot(right,bVar3 - 1);
        ptVar12 = btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>
                  ::GetField<2l>((btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>
                                  *)right);
        for (; ptVar12 <= psVar10; psVar10 = psVar10 + -1) {
          iVar1 = (psVar10->value).shape_id_;
          iVar2 = (psVar10->value).edge_id_;
          (psVar11->value).distance_.super_S1ChordAngle.length2_ =
               (psVar10->value).distance_.super_S1ChordAngle.length2_;
          (psVar11->value).shape_id_ = iVar1;
          (psVar11->value).edge_id_ = iVar2;
          psVar11 = psVar11 + -1;
        }
        pbVar8 = parent(this);
        bVar3 = position(this);
        psVar10 = slot(pbVar8,(uint)bVar3);
        psVar11 = slot(right,to_move + -1);
        iVar1 = (psVar10->value).shape_id_;
        iVar2 = (psVar10->value).edge_id_;
        (psVar11->value).distance_.super_S1ChordAngle.length2_ =
             (psVar10->value).distance_.super_S1ChordAngle.length2_;
        (psVar11->value).shape_id_ = iVar1;
        (psVar11->value).edge_id_ = iVar2;
        bVar3 = count(this);
        psVar10 = slot(this,(uint)bVar3 - (to_move + -1));
        bVar3 = count(this);
        psVar11 = slot(this,(uint)bVar3);
        ptVar12 = btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>
                  ::GetField<2l>((btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>
                                  *)right);
        for (; psVar10 != psVar11; psVar10 = psVar10 + 1) {
          iVar1 = (psVar10->value).shape_id_;
          iVar2 = (psVar10->value).edge_id_;
          (ptVar12->value).distance_.super_S1ChordAngle.length2_ =
               (psVar10->value).distance_.super_S1ChordAngle.length2_;
          (ptVar12->value).shape_id_ = iVar1;
          (ptVar12->value).edge_id_ = iVar2;
          ptVar12 = ptVar12 + 1;
        }
      }
      local_48 = (ulong)(uint)to_move;
      bVar3 = count(this);
      psVar10 = slot(this,(uint)bVar3 - to_move);
      pbVar8 = parent(this);
      bVar3 = position(this);
      psVar11 = slot(pbVar8,(uint)bVar3);
      iVar1 = (psVar10->value).shape_id_;
      iVar2 = (psVar10->value).edge_id_;
      (psVar11->value).distance_.super_S1ChordAngle.length2_ =
           (psVar10->value).distance_.super_S1ChordAngle.length2_;
      (psVar11->value).shape_id_ = iVar1;
      (psVar11->value).edge_id_ = iVar2;
      bVar3 = count(this);
      value_destroy_n(this,(long)(int)((uint)bVar3 - to_move),local_48,alloc);
      bVar5 = leaf(this);
      if (!bVar5) {
        bVar3 = count(right);
        for (i = (uint)bVar3; -1 < (int)i; i = i - 1) {
          pbVar8 = child(right,i);
          init_child(right,to_move + i,pbVar8);
          btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>
          ::GetField<3l>((btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>
                          *)right);
        }
        iVar7 = 1;
        iVar14 = -to_move;
        while (iVar14 = iVar14 + 1, iVar14 != 1) {
          bVar3 = count(this);
          pbVar8 = child(this,(uint)bVar3 + iVar14);
          init_child(right,iVar7 + -1,pbVar8);
          count(this);
          btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>
          ::GetField<3l>((btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>
                          *)this);
          iVar7 = iVar7 + 1;
        }
      }
      fVar6 = count(this);
      ptVar13 = btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>
                ::GetField<1l>((btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>
                                *)this);
      ptVar13[2] = fVar6 - (char)to_move;
      fVar6 = count(right);
      ptVar13 = btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>
                ::GetField<1l>((btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>
                                *)right);
      ptVar13[2] = fVar6 + (char)to_move;
      return;
    }
    __assert_fail("to_move <= count()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x62b,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>]"
                 );
  }
  __assert_fail("to_move >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                ,0x62a,
                "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result, std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>, 256, false>]"
               );
}

Assistant:

void btree_node<P>::rebalance_left_to_right(const int to_move,
                                            btree_node *right,
                                            allocator_type *alloc) {
  assert(parent() == right->parent());
  assert(position() + 1 == right->position());
  assert(count() >= right->count());
  assert(to_move >= 1);
  assert(to_move <= count());

  // Values in the right node are shifted to the right to make room for the
  // new to_move values. Then, the delimiting value in the parent and the
  // other (to_move - 1) values in the left node are moved into the right node.
  // Lastly, a new delimiting value is moved from the left node into the
  // parent, and the remaining empty left node entries are destroyed.

  if (right->count() >= to_move) {
    // The original location of the right->count() values are sufficient to hold
    // the new to_move entries from the parent and left node.

    // 1) Shift existing values in the right node to their correct positions.
    right->uninitialized_move_n(to_move, right->count() - to_move,
                                right->count(), right, alloc);
    for (slot_type *src = right->slot(right->count() - to_move - 1),
                   *dest = right->slot(right->count() - 1),
                   *end = right->slot(0);
         src >= end; --src, --dest) {
      slot_type::move(alloc, src, dest);
    }

    // 2) Move the delimiting value in the parent to the right node.
    slot_type::move(alloc, parent()->slot(position()),
                    right->slot(to_move - 1));

    // 3) Move the (to_move - 1) values from the left node to the right node.
    slot_type::move(alloc, slot(count() - (to_move - 1)), slot(count()),
                    right->slot(0));
  } else {
    // The right node does not have enough initialized space to hold the new
    // to_move entries, so part of them will move to uninitialized space.

    // 1) Shift existing values in the right node to their correct positions.
    right->uninitialized_move_n(right->count(), 0, to_move, right, alloc);

    // 2) Move the delimiting value in the parent to the right node.
    right->value_init(to_move - 1, alloc, parent()->slot(position()));

    // 3) Move the (to_move - 1) values from the left node to the right node.
    const size_type uninitialized_remaining = to_move - right->count() - 1;
    uninitialized_move_n(uninitialized_remaining,
                         count() - uninitialized_remaining, right->count(),
                         right, alloc);
    slot_type::move(alloc, slot(count() - (to_move - 1)),
                    slot(count() - uninitialized_remaining), right->slot(0));
  }

  // 4) Move the new delimiting value to the parent from the left node.
  slot_type::move(alloc, slot(count() - to_move), parent()->slot(position()));

  // 5) Destroy the now-empty to_move entries in the left node.
  value_destroy_n(count() - to_move, to_move, alloc);

  if (!leaf()) {
    // Move the child pointers from the left to the right node.
    for (int i = right->count(); i >= 0; --i) {
      right->init_child(i + to_move, right->child(i));
      right->clear_child(i);
    }
    for (int i = 1; i <= to_move; ++i) {
      right->init_child(i - 1, child(count() - to_move + i));
      clear_child(count() - to_move + i);
    }
  }

  // Fixup the counts on the left and right nodes.
  set_count(count() - to_move);
  right->set_count(right->count() + to_move);
}